

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ast.cpp
# Opt level: O2

bool __thiscall
xscript::parser::ast::parse_import_declaration
          (ast *this,
          unique_ptr<xscript::parser::ast_node,_std::default_delete<xscript::parser::ast_node>_>
          *parent)

{
  bool bVar1;
  token_t_conflict tVar2;
  unique_ptr<xscript::parser::ast_node,_std::default_delete<xscript::parser::ast_node>_> *parent_00;
  string *this_00;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> args;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> args_00;
  string local_70;
  basic_string_view<char,_std::char_traits<char>_> local_50;
  string local_40;
  allocator<char> local_19;
  
  parent_00 = ast_node::add_child((parent->_M_t).
                                  super___uniq_ptr_impl<xscript::parser::ast_node,_std::default_delete<xscript::parser::ast_node>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_xscript::parser::ast_node_*,_std::default_delete<xscript::parser::ast_node>_>
                                  .super__Head_base<0UL,_xscript::parser::ast_node_*,_false>.
                                  _M_head_impl,IMPORT_DECLARATION);
  if ((this->cur_token).type == TK_IMPORT) {
    next(this);
    bVar1 = parse_package_name(this,parent_00);
    if (!bVar1) {
      return false;
    }
    tVar2 = (this->cur_token).type;
    if (tVar2 == TK_AS) {
      bVar1 = parse_package_rename(this,parent_00);
      if (!bVar1) {
        return false;
      }
      tVar2 = (this->cur_token).type;
    }
    if (tVar2 == TK_SEMICOLON) {
      next(this);
      return true;
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_40,"build_O2/src/CMakeFiles/xscript.dir/compiler_depend.ts",
               &local_19);
    local_50._M_len = 0x25;
    local_50._M_str = "expected \';\' after import declaration";
    args_00._M_len = 1;
    args_00._M_array = &local_50;
    append_syntax_error(this,&local_40,0x104,args_00);
    this_00 = &local_40;
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_70,"build_O2/src/CMakeFiles/xscript.dir/compiler_depend.ts",
               &local_19);
    local_50._M_len = 0x1d;
    local_50._M_str = "<import declaration> expected";
    args._M_len = 1;
    args._M_array = &local_50;
    process_failover(this,&local_70,0xf5,args,true);
    this_00 = &local_70;
  }
  std::__cxx11::string::~string((string *)this_00);
  return false;
}

Assistant:

bool ast::parse_import_declaration(std::unique_ptr<ast_node>& parent) {
    std::unique_ptr<ast_node>& node = parent->add_child(IMPORT_DECLARATION);

    if (cur_token != tokenizer::TK_IMPORT) {
        return failover({"<import declaration> expected"});
    }
    next();

    if (!parse_package_name(node)) {
        return false;
    }

    if (cur_token == tokenizer::TK_AS) {
        if (!parse_package_rename(node)) {
            return false;
        }
    }

    if (cur_token != tokenizer::TK_SEMICOLON) {
        return syntax_error({"expected ';' after import declaration"});
    }
    next();

    return true;
}